

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O3

bool tcu::isNearestMipmapLinearSampleResultValid
               (ConstPixelBufferAccess *level0,ConstPixelBufferAccess *level1,Sampler *sampler,
               LookupPrecision *prec,Vec2 *coord,int coordZ,Vec2 *fBounds,Vec4 *result)

{
  int dim;
  int dim_00;
  int dim_01;
  int dim_02;
  uint uvBits;
  int c;
  int c_00;
  int c_01;
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Vec2 *fBounds_00;
  int iVar5;
  undefined4 in_register_0000008c;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  Vec4 c0;
  Vec2 uBounds1;
  Vec2 uBounds0;
  Vec4 c1;
  Vec2 vBounds1;
  Vec2 vBounds0;
  int local_c8;
  undefined1 local_98 [24];
  LookupPrecision *local_80;
  float local_78;
  float local_74;
  BVec4 local_70;
  float local_6c;
  undefined1 local_68 [16];
  TextureFormat local_58;
  int aiStack_50 [4];
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  dim = (level0->m_size).m_data[0];
  dim_00 = (level0->m_size).m_data[1];
  dim_01 = (level1->m_size).m_data[0];
  dim_02 = (level1->m_size).m_data[1];
  iVar5 = coordZ;
  local_98._16_8_ = level1;
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_70,sampler->normalizedCoords,dim,coord->m_data[0],
             (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_78,sampler->normalizedCoords,dim_01,coord->m_data[0],
             (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_38,sampler->normalizedCoords,dim_00,coord->m_data[1],
             (prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
  uvBits = (prec->uvwBits).m_data[1];
  fBounds_00 = (Vec2 *)(ulong)uvBits;
  local_80 = prec;
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_40,sampler->normalizedCoords,dim_02,coord->m_data[1],
             (prec->coordBits).m_data[1],uvBits);
  fVar6 = floorf((float)local_70.m_data);
  fVar7 = floorf(local_6c);
  fVar8 = floorf(local_78);
  fVar9 = floorf(local_74);
  fVar10 = floorf(local_38);
  local_c8 = (int)fVar10;
  fVar10 = floorf(local_34);
  fVar11 = floorf(local_40);
  fVar12 = floorf(local_3c);
  if (local_c8 <= (int)fVar10) {
    c = (int)fVar6;
    do {
      for (; c_00 = (int)fVar11, c <= (int)fVar7; c = c + 1) {
        for (; c_01 = (int)fVar8, c_00 <= (int)fVar12; c_00 = c_00 + 1) {
          for (; c_01 <= (int)fVar9; c_01 = c_01 + 1) {
            iVar3 = TexVerifierUtil::wrap(sampler->wrapS,c,dim);
            iVar4 = TexVerifierUtil::wrap(sampler->wrapT,local_c8,dim_00);
            if ((((iVar3 < 0) || ((level0->m_size).m_data[0] <= iVar3)) || (iVar4 < 0)) ||
               ((((level0->m_size).m_data[1] <= iVar4 || (coordZ < 0)) ||
                ((level0->m_size).m_data[2] <= coordZ)))) {
              sampleTextureBorder<float>((TextureFormat *)local_98,(Sampler *)level0);
            }
            else {
              fBounds_00 = (Vec2 *)(ulong)(uint)coordZ;
              ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)local_68,(int)level0,iVar3,iVar4);
              bVar2 = isSRGB(level0->m_format);
              if (bVar2) {
                sRGBToLinear((tcu *)local_98,(Vec4 *)local_68);
              }
            }
            iVar3 = TexVerifierUtil::wrap(sampler->wrapS,c_01,dim_01);
            iVar4 = TexVerifierUtil::wrap(sampler->wrapT,c_00,dim_02);
            uVar1 = local_98._16_8_;
            if (((iVar3 < 0) || ((int)*(WrapMode *)(local_98._16_8_ + 8) <= iVar3)) ||
               ((iVar4 < 0 ||
                ((((int)*(FilterMode *)(local_98._16_8_ + 0xc) <= iVar4 || (coordZ < 0)) ||
                 ((int)*(FilterMode *)(local_98._16_8_ + 0x10) <= coordZ)))))) {
              sampleTextureBorder<float>(&local_58,(Sampler *)local_98._16_8_);
            }
            else {
              fBounds_00 = (Vec2 *)(ulong)(uint)coordZ;
              ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)local_68,(int)local_98._16_8_,iVar3,iVar4);
              bVar2 = isSRGB(*(TextureFormat *)uVar1);
              if (bVar2) {
                sRGBToLinear((tcu *)&local_58,(Vec4 *)local_68);
              }
              else {
                local_58.order = local_68._0_4_;
                local_58.type = local_68._4_4_;
                aiStack_50[0] = local_68._8_4_;
                aiStack_50[1] = local_68._12_4_;
              }
            }
            bVar2 = isLinearRangeValid((tcu *)local_80,(LookupPrecision *)local_98,(Vec4 *)&local_58
                                       ,result,fBounds_00,
                                       (Vec4 *)CONCAT44(in_register_0000008c,iVar5));
            if (bVar2) {
              return true;
            }
          }
        }
      }
      local_c8 = local_c8 + 1;
      c = (int)fVar6;
    } while (local_c8 <= (int)fVar10);
  }
  return false;
}

Assistant:

static bool isNearestMipmapLinearSampleResultValid (const ConstPixelBufferAccess&	level0,
													const ConstPixelBufferAccess&	level1,
													const Sampler&					sampler,
													const LookupPrecision&			prec,
													const Vec2&						coord,
													const int						coordZ,
													const Vec2&						fBounds,
													const Vec4&						result)
{
	const int		w0				= level0.getWidth();
	const int		w1				= level1.getWidth();
	const int		h0				= level0.getHeight();
	const int		h1				= level1.getHeight();

	const Vec2		uBounds0		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, w0,	coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2		uBounds1		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, w1,	coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2		vBounds0		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, h0,	coord.y(), prec.coordBits.y(), prec.uvwBits.y());
	const Vec2		vBounds1		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, h1,	coord.y(), prec.coordBits.y(), prec.uvwBits.y());

	// Integer coordinates - without wrap mode
	const int		minI0			= deFloorFloatToInt32(uBounds0.x());
	const int		maxI0			= deFloorFloatToInt32(uBounds0.y());
	const int		minI1			= deFloorFloatToInt32(uBounds1.x());
	const int		maxI1			= deFloorFloatToInt32(uBounds1.y());
	const int		minJ0			= deFloorFloatToInt32(vBounds0.x());
	const int		maxJ0			= deFloorFloatToInt32(vBounds0.y());
	const int		minJ1			= deFloorFloatToInt32(vBounds1.x());
	const int		maxJ1			= deFloorFloatToInt32(vBounds1.y());

	for (int j0 = minJ0; j0 <= maxJ0; j0++)
	{
		for (int i0 = minI0; i0 <= maxI0; i0++)
		{
			for (int j1 = minJ1; j1 <= maxJ1; j1++)
			{
				for (int i1 = minI1; i1 <= maxI1; i1++)
				{
					const Vec4	c0	= lookup<float>(level0, sampler, wrap(sampler.wrapS, i0, w0), wrap(sampler.wrapT, j0, h0), coordZ);
					const Vec4	c1	= lookup<float>(level1, sampler, wrap(sampler.wrapS, i1, w1), wrap(sampler.wrapT, j1, h1), coordZ);

					if (isLinearRangeValid(prec, c0, c1, fBounds, result))
						return true;
				}
			}
		}
	}

	return false;
}